

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_observer.hpp
# Opt level: O0

void __thiscall libtorrent::dht::dht_observer::dht_observer(dht_observer *this)

{
  dht_observer *this_local;
  
  dht_logger::dht_logger(&this->super_dht_logger);
  (this->super_dht_logger)._vptr_dht_logger = (_func_int **)&PTR___cxa_pure_virtual_00b8fa20;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT dht_observer : dht_logger
	{
		virtual void set_external_address(aux::listen_socket_handle const& iface
			, address const& addr, address const& source) = 0;
		virtual int get_listen_port(aux::transport ssl, aux::listen_socket_handle const& s) const = 0;
		virtual void get_peers(sha1_hash const& ih) = 0;
		virtual void outgoing_get_peers(sha1_hash const& target
			, sha1_hash const& sent_target, udp::endpoint const& ep) = 0;
		virtual void announce(sha1_hash const& ih, address const& addr, int port) = 0;
		virtual bool on_dht_request(string_view query
			, dht::msg const& request, entry& response) = 0;

	protected:
		~dht_observer() = default;
	}